

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O2

void __thiscall Boards::noCheckPut(Boards *this,int x,int y,int turn)

{
  int *piVar1;
  pointer pvVar2;
  
  (this->board)._M_elems[x]._M_elems[y] = turn;
  pvVar2 = (this->delta).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    piVar1 = *(int **)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
    pvVar2 = pvVar2 + 1;
  } while (*piVar1 != 0);
  *piVar1 = turn;
  piVar1[1] = x;
  piVar1[2] = y;
  return;
}

Assistant:

void Boards::noCheckPut(int x, int y, int turn){
	int i = 0;
	board[x][y] = turn;
	while(delta[i][0]){ i++; }
	delta[i][0] = turn;
	delta[i][1] = x;
	delta[i][2] = y;
}